

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::AddISPCTargetFlags(cmGeneratorTarget *this,string *flags)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  string_view local_180;
  string_view local_170;
  string local_160;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  string_view local_c0;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  string local_90;
  string *local_70;
  string *compiler;
  char *local_60;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *property;
  string *flags_local;
  cmGeneratorTarget *this_local;
  
  property = flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ISPC_INSTRUCTION_SETS",&local_41);
  psVar2 = GetSafeProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = psVar2;
  sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
  local_60 = sVar3._M_str;
  compiler = (string *)sVar3._M_len;
  bVar1 = cmIsOff(sVar3);
  if (!bVar1) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_ISPC_COMPILER_ID",
               (allocator<char> *)
               ((long)&targets.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&targets.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_70 = psVar2;
    bVar1 = std::operator==(psVar2,"Intel");
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0);
      local_c0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
      cmExpandList(local_c0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_b0,false);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b0);
      if (!bVar1) {
        cmAlphaNum::cmAlphaNum(&local_110," --target=");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,",");
        sVar3._M_str = local_190._M_str;
        sVar3._M_len = local_190._M_len;
        cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_160,local_170,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b0,local_180,sVar3);
        cmAlphaNum::cmAlphaNum(&local_140,&local_160);
        cmStrCat<>(&local_e0,&local_110,&local_140);
        std::__cxx11::string::operator+=((string *)property,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_160);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b0);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddISPCTargetFlags(std::string& flags) const
{
  const std::string& property = this->GetSafeProperty("ISPC_INSTRUCTION_SETS");

  // If ISPC_TARGET is false we don't add any architectures.
  if (cmIsOff(property)) {
    return;
  }

  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_ISPC_COMPILER_ID");

  if (compiler == "Intel") {
    std::vector<std::string> targets;
    cmExpandList(property, targets);
    if (!targets.empty()) {
      flags += cmStrCat(" --target=", cmWrap("", targets, "", ","));
    }
  }
}